

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.h
# Opt level: O1

void __thiscall google::protobuf::compiler::cpp::CppGenerator::~CppGenerator(CppGenerator *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_CodeGenerator)._vptr_CodeGenerator = (_func_int **)&PTR__CppGenerator_0051d9a8;
  pcVar2 = (this->runtime_include_base_)._M_dataplus._M_p;
  paVar1 = &(this->runtime_include_base_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  CodeGenerator::~CodeGenerator(&this->super_CodeGenerator);
  return;
}

Assistant:

~CppGenerator() override = default;